

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfElseReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp,Sinkables *ifTrue)

{
  _Rb_tree_node_base *__x;
  Sinkables *this_00;
  uintptr_t uVar1;
  SimplifyLocals<true,_true,_true> *pSVar2;
  Expression *pEVar3;
  Nop *output;
  size_type sVar4;
  _Base_ptr p_Var5;
  Block *pBVar6;
  mapped_type *pmVar7;
  LocalSet *pLVar8;
  Expression **ppEVar9;
  Expression **ppEVar10;
  _Rb_tree_node_base *index;
  uintptr_t uVar11;
  SimplifyLocals<true,_true,_true> *this_01;
  Block *this_02;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Builder local_60;
  Expression **local_58;
  Sinkables *local_50;
  SimplifyLocals<true,_true,_true> *local_48;
  If *local_40;
  If *iff_local;
  
  index = (_Rb_tree_node_base *)iff->ifFalse;
  local_40 = iff;
  if (index == (_Rb_tree_node_base *)0x0) {
    __assert_fail("iff->ifFalse",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                  ,0x27a,
                  "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                 );
  }
  if ((iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 0) {
    return;
  }
  this_00 = &this->sinkables;
  pBVar6 = (Block *)iff->ifTrue;
  uVar11 = (pBVar6->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  uVar1 = ((Type *)&index->_M_parent)->id;
  local_58 = currp;
  local_50 = ifTrue;
  if (uVar11 == 1) {
    if (uVar1 == 1) {
      __assert_fail("iff->ifFalse->type != Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x295,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    if ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return;
    }
    iff_local._4_4_ =
         (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    uVar11 = 1;
  }
  else {
    local_48 = this;
    if (uVar1 == 1) {
      if ((ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        return;
      }
      iff_local._4_4_ = (ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    }
    else {
      p_Var5 = (ifTrue->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var5 == &(ifTrue->_M_t)._M_impl.super__Rb_tree_header) {
          return;
        }
        __x = p_Var5 + 1;
        index = __x;
        sVar4 = std::
                map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                ::count(this_00,&__x->_M_color);
        if (sVar4 != 0) break;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      }
      iff_local._4_4_ = __x->_M_color;
      pBVar6 = (Block *)iff->ifTrue;
      uVar11 = (pBVar6->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
      this = local_48;
    }
  }
  this_02 = (Block *)0x0;
  if ((pBVar6->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId) {
    this_02 = pBVar6;
  }
  if ((uVar11 == 1) ||
     ((((this_02 != (Block *)0x0 && ((this_02->name).super_IString.str._M_str == (char *)0x0)) &&
       ((this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements != 0)) &&
      (ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(this_02->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ), (*ppEVar10)->_id == NopId)))) {
    pSVar2 = (SimplifyLocals<true,_true,_true> *)iff->ifFalse;
    this_01 = (SimplifyLocals<true,_true,_true> *)0x0;
    if (*(Id *)&(pSVar2->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                ).super_Pass._vptr_Pass == BlockId) {
      this_01 = pSVar2;
    }
    if ((((Type *)&(pSVar2->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                   ).super_Pass.runner)->id == 1) ||
       (((this_01 != (SimplifyLocals<true,_true,_true> *)0x0 &&
         ((this_01->
          super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
          ).super_Pass.name._M_string_length == 0)) &&
        ((*(long *)((long)&(this_01->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                           ).super_Pass.name.field_2 + 8) != 0 &&
         (ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                               ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 *)&(this_01->
                                    super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                    ).super_Pass.name.field_2), (*ppEVar10)->_id == NopId)))))) {
      if ((iff->ifTrue->type).id != 1) {
        local_48 = this_01;
        pmVar7 = std::
                 map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                 ::at(local_50,(key_type *)((long)&iff_local + 4));
        ppEVar10 = pmVar7->item;
        pLVar8 = Expression::cast<wasm::LocalSet>(*ppEVar10);
        pEVar3 = pLVar8->value;
        index = (_Rb_tree_node_base *)
                ((this_02->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements - 1);
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(this_02->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)index);
        *ppEVar9 = pEVar3;
        pEVar3 = *ppEVar10;
        pEVar3->_id = NopId;
        (pEVar3->type).id = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
        Block::finalize(this_02,type_,Unknown);
        iff = local_40;
        this_01 = local_48;
        if ((this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
            0) {
          __assert_fail("ifTrueBlock->type != Type::none",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x2ca,
                        "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
      }
      if ((iff->ifFalse->type).id != 1) {
        pmVar7 = std::
                 map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                 ::at(this_00,(key_type *)((long)&iff_local + 4));
        ppEVar10 = pmVar7->item;
        pLVar8 = Expression::cast<wasm::LocalSet>(*ppEVar10);
        pEVar3 = pLVar8->value;
        index = (_Rb_tree_node_base *)
                (*(long *)((long)&(this_01->
                                  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                  ).super_Pass.name.field_2 + 8) + -1);
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&(this_01->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).super_Pass.name.field_2,(size_t)index);
        *ppEVar9 = pEVar3;
        pEVar3 = *ppEVar10;
        pEVar3->_id = NopId;
        (pEVar3->type).id = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
        Block::finalize((Block *)this_01,type__00,Unknown);
        iff = local_40;
        if ((this_01->
            super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
            ).super_Pass.runner == (PassRunner *)0x0) {
          __assert_fail("ifFalseBlock->type != Type::none",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x2d2,
                        "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
      }
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)index;
      If::finalize(iff,type__01);
      if ((local_40->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id !=
          0) {
        local_60.wasm =
             (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
             .currModule;
        pLVar8 = Builder::makeLocalSet(&local_60,iff_local._4_4_,(Expression *)local_40);
        *local_58 = (Expression *)pLVar8;
        this->anotherCycle = true;
        return;
      }
      __assert_fail("iff->type != Type::none",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x2d5,
                    "void wasm::SimplifyLocals<>::optimizeIfElseReturn(If *, Expression **, Sinkables &) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
  }
  std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back(&this->ifsToEnlarge,&local_40);
  return;
}

Assistant:

void optimizeIfElseReturn(If* iff, Expression** currp, Sinkables& ifTrue) {
    assert(iff->ifFalse);
    // if this if already has a result, or is unreachable code, we have
    // nothing to do
    if (iff->type != Type::none) {
      return;
    }
    // We now have the sinkables from both sides of the if, and can look
    // for something to sink. That is either a shared index on both sides,
    // *or* if one side is unreachable, we can sink anything from the other,
    //   (if
    //     (..)
    //     (br $x)
    //     (local.set $y (..))
    //   )
    //    =>
    //   (local.set $y
    //     (if (result i32)
    //       (..)
    //       (br $x)
    //       (..)
    //     )
    //   )
    Sinkables& ifFalse = sinkables;
    Index goodIndex = -1;
    bool found = false;
    if (iff->ifTrue->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifFalse->type != Type::unreachable);
      if (!ifFalse.empty()) {
        goodIndex = ifFalse.begin()->first;
        found = true;
      }
    } else if (iff->ifFalse->type == Type::unreachable) {
      // since the if type is none
      assert(iff->ifTrue->type != Type::unreachable);
      if (!ifTrue.empty()) {
        goodIndex = ifTrue.begin()->first;
        found = true;
      }
    } else {
      // Look for a shared index.
      for (auto& [index, _] : ifTrue) {
        if (ifFalse.count(index) > 0) {
          goodIndex = index;
          found = true;
          break;
        }
      }
    }
    if (!found) {
      return;
    }
    // great, we can optimize!
    // ensure we have a place to write the return values for, if not, we
    // need another cycle
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (iff->ifTrue->type != Type::unreachable) {
      if (!ifTrueBlock || ifTrueBlock->name.is() ||
          ifTrueBlock->list.size() == 0 ||
          !ifTrueBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    auto* ifFalseBlock = iff->ifFalse->dynCast<Block>();
    if (iff->ifFalse->type != Type::unreachable) {
      if (!ifFalseBlock || ifFalseBlock->name.is() ||
          ifFalseBlock->list.size() == 0 ||
          !ifFalseBlock->list.back()->is<Nop>()) {
        ifsToEnlarge.push_back(iff);
        return;
      }
    }
    // all set, go
    if (iff->ifTrue->type != Type::unreachable) {
      auto* ifTrueItem = ifTrue.at(goodIndex).item;
      ifTrueBlock->list[ifTrueBlock->list.size() - 1] =
        (*ifTrueItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifTrueItem);
      ifTrueBlock->finalize();
      assert(ifTrueBlock->type != Type::none);
    }
    if (iff->ifFalse->type != Type::unreachable) {
      auto* ifFalseItem = ifFalse.at(goodIndex).item;
      ifFalseBlock->list[ifFalseBlock->list.size() - 1] =
        (*ifFalseItem)->template cast<LocalSet>()->value;
      ExpressionManipulator::nop(*ifFalseItem);
      ifFalseBlock->finalize();
      assert(ifFalseBlock->type != Type::none);
    }
    iff->finalize(); // update type
    assert(iff->type != Type::none);
    // finally, create a local.set on the iff itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(goodIndex, iff);
    *currp = newLocalSet;
    anotherCycle = true;
  }